

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined4 uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  NodeRef *pNVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  Primitive *prim;
  ulong unaff_R13;
  size_t mask;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  vint4 bi;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vint4 ai;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar28;
  float fVar29;
  undefined1 auVar27 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Precalculations pre;
  NodeRef stack [244];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      pNVar10 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar2 = (ray->dir).field_0;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx((undefined1  [16])aVar2,auVar27);
      auVar31._8_4_ = 0x219392ef;
      auVar31._0_8_ = 0x219392ef219392ef;
      auVar31._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar31,1);
      auVar27 = vblendvps_avx((undefined1  [16])aVar2,auVar31,auVar27);
      auVar31 = vrcpps_avx(auVar27);
      fVar26 = auVar31._0_4_;
      auVar24._0_4_ = fVar26 * auVar27._0_4_;
      fVar28 = auVar31._4_4_;
      auVar24._4_4_ = fVar28 * auVar27._4_4_;
      fVar29 = auVar31._8_4_;
      auVar24._8_4_ = fVar29 * auVar27._8_4_;
      fVar30 = auVar31._12_4_;
      auVar24._12_4_ = fVar30 * auVar27._12_4_;
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = &DAT_3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar32,auVar24);
      auVar25._0_4_ = fVar26 + fVar26 * auVar27._0_4_;
      auVar25._4_4_ = fVar28 + fVar28 * auVar27._4_4_;
      auVar25._8_4_ = fVar29 + fVar29 * auVar27._8_4_;
      auVar25._12_4_ = fVar30 + fVar30 * auVar27._12_4_;
      uVar6 = *(undefined4 *)&(ray->org).field_0;
      auVar33._4_4_ = uVar6;
      auVar33._0_4_ = uVar6;
      auVar33._8_4_ = uVar6;
      auVar33._12_4_ = uVar6;
      uVar6 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar34._4_4_ = uVar6;
      auVar34._0_4_ = uVar6;
      auVar34._8_4_ = uVar6;
      auVar34._12_4_ = uVar6;
      uVar6 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar35._4_4_ = uVar6;
      auVar35._0_4_ = uVar6;
      auVar35._8_4_ = uVar6;
      auVar35._12_4_ = uVar6;
      auVar24 = vshufps_avx(auVar25,auVar25,0);
      auVar27 = vmovshdup_avx(auVar25);
      auVar32 = vshufps_avx(auVar25,auVar25,0x55);
      auVar31 = vshufpd_avx(auVar25,auVar25,1);
      auVar4 = vshufps_avx(auVar25,auVar25,0xaa);
      uVar11 = (ulong)(auVar25._0_4_ < 0.0) * 0x10;
      uVar12 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x20;
      uVar13 = (ulong)(auVar31._0_4_ < 0.0) << 4 | 0x40;
      auVar27 = vshufps_avx(auVar3,auVar3,0);
      auVar3 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      do {
        if (pNVar10 == stack) {
          return;
        }
        sVar15 = pNVar10[-1].ptr;
        pNVar10 = pNVar10 + -1;
        do {
          if ((sVar15 & 8) == 0) {
            auVar31 = vsubps_avx(*(undefined1 (*) [16])(sVar15 + 0x20 + uVar11),auVar33);
            auVar18._0_4_ = auVar24._0_4_ * auVar31._0_4_;
            auVar18._4_4_ = auVar24._4_4_ * auVar31._4_4_;
            auVar18._8_4_ = auVar24._8_4_ * auVar31._8_4_;
            auVar18._12_4_ = auVar24._12_4_ * auVar31._12_4_;
            auVar31 = vsubps_avx(*(undefined1 (*) [16])(sVar15 + 0x20 + uVar12),auVar34);
            auVar19._0_4_ = auVar32._0_4_ * auVar31._0_4_;
            auVar19._4_4_ = auVar32._4_4_ * auVar31._4_4_;
            auVar19._8_4_ = auVar32._8_4_ * auVar31._8_4_;
            auVar19._12_4_ = auVar32._12_4_ * auVar31._12_4_;
            auVar31 = vpmaxsd_avx(auVar18,auVar19);
            auVar25 = vsubps_avx(*(undefined1 (*) [16])(sVar15 + 0x20 + uVar13),auVar35);
            auVar20._0_4_ = auVar4._0_4_ * auVar25._0_4_;
            auVar20._4_4_ = auVar4._4_4_ * auVar25._4_4_;
            auVar20._8_4_ = auVar4._8_4_ * auVar25._8_4_;
            auVar20._12_4_ = auVar4._12_4_ * auVar25._12_4_;
            auVar25 = vpmaxsd_avx(auVar20,auVar27);
            auVar31 = vpmaxsd_avx(auVar31,auVar25);
            auVar25 = vsubps_avx(*(undefined1 (*) [16])(sVar15 + 0x20 + (uVar11 ^ 0x10)),auVar33);
            auVar21._0_4_ = auVar24._0_4_ * auVar25._0_4_;
            auVar21._4_4_ = auVar24._4_4_ * auVar25._4_4_;
            auVar21._8_4_ = auVar24._8_4_ * auVar25._8_4_;
            auVar21._12_4_ = auVar24._12_4_ * auVar25._12_4_;
            auVar25 = vsubps_avx(*(undefined1 (*) [16])(sVar15 + 0x20 + (uVar12 ^ 0x10)),auVar34);
            auVar22._0_4_ = auVar32._0_4_ * auVar25._0_4_;
            auVar22._4_4_ = auVar32._4_4_ * auVar25._4_4_;
            auVar22._8_4_ = auVar32._8_4_ * auVar25._8_4_;
            auVar22._12_4_ = auVar32._12_4_ * auVar25._12_4_;
            auVar25 = vpminsd_avx(auVar21,auVar22);
            auVar18 = vsubps_avx(*(undefined1 (*) [16])(sVar15 + 0x20 + (uVar13 ^ 0x10)),auVar35);
            auVar23._0_4_ = auVar4._0_4_ * auVar18._0_4_;
            auVar23._4_4_ = auVar4._4_4_ * auVar18._4_4_;
            auVar23._8_4_ = auVar4._8_4_ * auVar18._8_4_;
            auVar23._12_4_ = auVar4._12_4_ * auVar18._12_4_;
            auVar18 = vpminsd_avx(auVar23,auVar3);
            auVar25 = vpminsd_avx(auVar25,auVar18);
            auVar31 = vpcmpgtd_avx(auVar31,auVar25);
            uVar6 = vmovmskps_avx(auVar31);
            unaff_R13 = (ulong)(byte)((byte)uVar6 ^ 0xf);
          }
          if ((sVar15 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar16 = 4;
            }
            else {
              uVar14 = sVar15 & 0xfffffffffffffff0;
              lVar8 = 0;
              if (unaff_R13 != 0) {
                for (; (unaff_R13 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                }
              }
              iVar16 = 0;
              sVar15 = *(size_t *)(uVar14 + lVar8 * 8);
              uVar9 = unaff_R13 - 1 & unaff_R13;
              if (uVar9 != 0) {
                pNVar10->ptr = sVar15;
                lVar8 = 0;
                if (uVar9 != 0) {
                  for (; (uVar9 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                  }
                }
                uVar7 = uVar9 - 1;
                while( true ) {
                  pNVar10 = pNVar10 + 1;
                  sVar15 = *(size_t *)(uVar14 + lVar8 * 8);
                  uVar7 = uVar7 & uVar9;
                  if (uVar7 == 0) break;
                  pNVar10->ptr = sVar15;
                  lVar8 = 0;
                  if (uVar7 != 0) {
                    for (; (uVar7 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
                    }
                  }
                  uVar9 = uVar7 - 1;
                }
              }
            }
          }
          else {
            iVar16 = 6;
          }
        } while (iVar16 == 0);
        if (iVar16 == 6) {
          uVar14 = (ulong)((uint)sVar15 & 0xf);
          iVar16 = 0;
          bVar17 = uVar14 != 8;
          if (bVar17) {
            prim = (Primitive *)(sVar15 & 0xfffffffffffffff0);
            bVar5 = InstanceArrayIntersector1::occluded(&pre,ray,context,prim);
            if (!bVar5) {
              uVar9 = 0;
              do {
                prim = prim + 1;
                if (uVar14 - 9 == uVar9) goto LAB_002e3f60;
                bVar17 = InstanceArrayIntersector1::occluded(&pre,ray,context,prim);
                uVar9 = uVar9 + 1;
              } while (!bVar17);
              bVar17 = uVar9 < uVar14 - 8;
            }
            iVar16 = 0;
            if (bVar17) {
              ray->tfar = -INFINITY;
              iVar16 = 3;
            }
          }
        }
LAB_002e3f60:
      } while (iVar16 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }